

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_array_defs.h
# Opt level: O2

bool __thiscall
ON_SimpleArray<VertexToDuplicate>::QuickSortAndRemoveDuplicates
          (ON_SimpleArray<VertexToDuplicate> *this,
          _func_int_VertexToDuplicate_ptr_VertexToDuplicate_ptr *compar)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  uint uVar3;
  ON_SubDVertex *pOVar4;
  ON_SubDFace *pOVar5;
  undefined8 uVar6;
  int iVar7;
  int iVar8;
  VertexToDuplicate *pVVar9;
  long lVar10;
  long lVar11;
  int i;
  long lVar12;
  
  if (this->m_a != (VertexToDuplicate *)0x0) {
    uVar3 = this->m_count;
    if (compar != (_func_int_VertexToDuplicate_ptr_VertexToDuplicate_ptr *)0x0 &&
        0 < (long)(int)uVar3) {
      if (uVar3 < 2) {
        return true;
      }
      lVar10 = 0x20;
      ON_qsort(this->m_a,(long)(int)uVar3,0x20,(_func_int_void_ptr_void_ptr *)compar);
      pVVar9 = this->m_a;
      iVar8 = 1;
      lVar12 = 1;
      while( true ) {
        iVar7 = this->m_count;
        lVar11 = (long)iVar8;
        if (iVar7 <= lVar12) break;
        iVar7 = (*compar)(pVVar9,(VertexToDuplicate *)((long)&this->m_a->m_vertex + lVar10));
        if (iVar7 != 0) {
          if (lVar11 < lVar12) {
            pVVar9 = this->m_a;
            puVar1 = (undefined8 *)((long)&pVVar9->m_vertex + lVar10);
            pOVar4 = (ON_SubDVertex *)*puVar1;
            pOVar5 = (ON_SubDFace *)puVar1[1];
            puVar1 = (undefined8 *)((long)&pVVar9->m_face + lVar10 + 4);
            uVar6 = puVar1[1];
            puVar2 = (undefined8 *)((long)&pVVar9[lVar11].m_face + 4);
            *puVar2 = *puVar1;
            puVar2[1] = uVar6;
            pVVar9[lVar11].m_vertex = pOVar4;
            pVVar9[lVar11].m_face = pOVar5;
          }
          pVVar9 = this->m_a + lVar11;
          iVar8 = iVar8 + 1;
        }
        lVar12 = lVar12 + 1;
        lVar10 = lVar10 + 0x20;
      }
      if ((iVar7 - iVar8 != 0 && iVar8 <= iVar7) &&
         (memset(this->m_a + lVar11,0,(long)(iVar7 - iVar8) << 5), -1 < iVar8)) {
        if (this->m_capacity < iVar8) {
          return true;
        }
        this->m_count = iVar8;
        return true;
      }
      return true;
    }
  }
  return false;
}

Assistant:

bool ON_SimpleArray<T>::QuickSortAndRemoveDuplicates( int (*compar)(const T*,const T*) )
{
  bool rc = false;
  if ( m_a && m_count > 0 && compar )
  {
    if (m_count > 1)
    {
      ON_qsort(m_a, m_count, sizeof(T), (int(*)(const void*, const void*))compar);
      const T* prev_ele = &m_a[0];
      int clean_count = 1;
      for (int i = 1; i < m_count; ++i)
      {
        if (0 == compar(prev_ele, &m_a[i]))
          continue; // duplicate
        if (i > clean_count)
          m_a[clean_count] = m_a[i];
        prev_ele = &m_a[clean_count];
        ++clean_count;
      }
      if (clean_count < m_count)
      {
        memset( (void*)(&m_a[clean_count]), 0, (m_count-clean_count)*sizeof(T) );
        SetCount(clean_count);
      }
    }
    rc = true;
  }
  return rc;
}